

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void * voc_stk_alo(voccxdef *ctx,uint siz)

{
  void *pvVar1;
  size_t sVar2;
  uint in_ESI;
  long in_RDI;
  void *ret;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar2 = osrndsz((ulong)in_ESI);
  if (*(ulong *)(in_RDI + 0x11b8) < *(long *)(in_RDI + 0x11b0) + (sVar2 & 0xffffffff)) {
    errsigf((errcxdef *)CONCAT44((int)sVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,0);
  }
  pvVar1 = *(void **)(in_RDI + 0x11b0);
  *(size_t *)(in_RDI + 0x11b0) = *(long *)(in_RDI + 0x11b0) + (sVar2 & 0xffffffff);
  return pvVar1;
}

Assistant:

void *voc_stk_alo(voccxdef *ctx, uint siz)
{
    void *ret;
    
    /* round size up to allocation units */
    siz = osrndsz(siz);

    /* if there's not space, signal an error */
    if (ctx->voc_stk_cur + siz > ctx->voc_stk_end)
        errsig(ctx->voccxerr, ERR_VOCSTK);

    /* save the return pointer */
    ret = ctx->voc_stk_cur;

    /* consume the space */
    ctx->voc_stk_cur += siz;

/*#define SHOW_HI*/
#ifdef SHOW_HI
{
    static uint maxsiz;
    if (ctx->voc_stk_cur - ctx->voc_stk_ptr > maxsiz)
    {
        char buf[20];
        
        maxsiz = ctx->voc_stk_cur - ctx->voc_stk_ptr;
        sprintf(buf, "%u\n", maxsiz);
        os_printz(buf);
    }
}
#endif


    /* return the space */
    return ret;
}